

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::LabelTests_PrintHieroUnary_Test::LabelTests_PrintHieroUnary_Test
          (LabelTests_PrintHieroUnary_Test *this)

{
  LabelTests_PrintHieroUnary_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__LabelTests_PrintHieroUnary_Test_001bd188;
  return;
}

Assistant:

TEST(LabelTests, PrintHieroUnary) {
  auto asp = readAlignedSentencePair<false, false>("a\tb\t0-0");
  std::ostringstream s;
  PhrasalRule rule{asp};
  rule.nts.front() = NT(asp.span(), "X");
  auto nt = rule.nts.front().span;
  s << rule;
  EXPECT_EQ("[X]\t[X,1]\t[X,1]\t", s.str());
}